

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O0

void __thiscall
libtorrent::piece_picker::abort_download(piece_picker *this,piece_block block,torrent_peer *peer)

{
  ushort uVar1;
  uint uVar2;
  uchar uVar3;
  uchar uVar4;
  int priority;
  int iVar5;
  value_type *pvVar6;
  reference dp;
  block_info *pbVar7;
  pointer pdVar8;
  int prio;
  int prev_prio;
  piece_pos *p;
  block_info *info;
  span<libtorrent::piece_picker::block_info> binfo;
  __normal_iterator<libtorrent::piece_picker::downloading_piece_*,_std::vector<libtorrent::piece_picker::downloading_piece,_std::allocator<libtorrent::piece_picker::downloading_piece>_>_>
  local_30;
  iterator i;
  download_queue_t state;
  torrent_peer *peer_local;
  piece_picker *this_local;
  piece_block block_local;
  
  this_local._0_4_ = (int)block.piece_index.m_val;
  i._M_current._0_4_ = this_local._0_4_;
  pvVar6 = libtorrent::aux::
           container_wrapper<libtorrent::piece_picker::piece_pos,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>_>
           ::operator[](&this->m_piece_map,this_local._0_4_);
  i._M_current._7_1_ = piece_pos::download_queue(pvVar6);
  uVar3 = libtorrent::aux::strong_typedef::operator_cast_to_unsigned_char
                    ((strong_typedef *)((long)&i._M_current + 7));
  uVar4 = libtorrent::aux::strong_typedef::operator_cast_to_unsigned_char
                    ((strong_typedef *)&piece_pos::piece_open);
  if (uVar3 != uVar4) {
    binfo.m_len._7_1_ = i._M_current._7_1_;
    binfo.m_len._0_4_ = this_local._0_4_;
    local_30._M_current =
         (downloading_piece *)find_dl_piece(this,i._M_current._7_1_,(piece_index_t)this_local._0_4_)
    ;
    dp = __gnu_cxx::
         __normal_iterator<libtorrent::piece_picker::downloading_piece_*,_std::vector<libtorrent::piece_picker::downloading_piece,_std::allocator<libtorrent::piece_picker::downloading_piece>_>_>
         ::operator*(&local_30);
    _info = mutable_blocks_for_piece(this,dp);
    this_local._4_4_ = block.block_index;
    pbVar7 = span<libtorrent::piece_picker::block_info>::operator[]
                       ((span<libtorrent::piece_picker::block_info> *)&info,(long)this_local._4_4_);
    if (*(ushort *)&pbVar7->field_0x8 >> 0xe == 1) {
      pvVar6 = libtorrent::aux::
               container_wrapper<libtorrent::piece_picker::piece_pos,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>_>
               ::operator[](&this->m_piece_map,this_local._0_4_);
      priority = piece_pos::priority(pvVar6,this);
      if ((*(ushort *)&pbVar7->field_0x8 & 0x3fff) != 0) {
        *(ushort *)&pbVar7->field_0x8 =
             *(ushort *)&pbVar7->field_0x8 & 0xc000 |
             (*(ushort *)&pbVar7->field_0x8 & 0x3fff) - 1 & 0x3fff;
      }
      if (pbVar7->peer == peer) {
        pbVar7->peer = (torrent_peer *)0x0;
      }
      if ((*(ushort *)&pbVar7->field_0x8 & 0x3fff) == 0) {
        pbVar7->peer = (torrent_peer *)0x0;
        *(ushort *)&pbVar7->field_0x8 = *(ushort *)&pbVar7->field_0x8 & 0x3fff;
        pdVar8 = __gnu_cxx::
                 __normal_iterator<libtorrent::piece_picker::downloading_piece_*,_std::vector<libtorrent::piece_picker::downloading_piece,_std::allocator<libtorrent::piece_picker::downloading_piece>_>_>
                 ::operator->(&local_30);
        *(ushort *)&pdVar8->field_0xa =
             *(ushort *)&pdVar8->field_0xa & 0x8000 |
             (*(ushort *)&pdVar8->field_0xa & 0x7fff) - 1 & 0x7fff;
        pdVar8 = __gnu_cxx::
                 __normal_iterator<libtorrent::piece_picker::downloading_piece_*,_std::vector<libtorrent::piece_picker::downloading_piece,_std::allocator<libtorrent::piece_picker::downloading_piece>_>_>
                 ::operator->(&local_30);
        uVar1 = *(ushort *)&pdVar8->field_0xa;
        pdVar8 = __gnu_cxx::
                 __normal_iterator<libtorrent::piece_picker::downloading_piece_*,_std::vector<libtorrent::piece_picker::downloading_piece,_std::allocator<libtorrent::piece_picker::downloading_piece>_>_>
                 ::operator->(&local_30);
        uVar2 = *(uint *)&pdVar8->field_0x6;
        pdVar8 = __gnu_cxx::
                 __normal_iterator<libtorrent::piece_picker::downloading_piece_*,_std::vector<libtorrent::piece_picker::downloading_piece,_std::allocator<libtorrent::piece_picker::downloading_piece>_>_>
                 ::operator->(&local_30);
        if ((uint)(uVar1 & 0x7fff) + (uVar2 & 0x7fff) +
            (*(uint *)&pdVar8->field_0x6 >> 0x10 & 0x7fff) == 0) {
          erase_download_piece(this,(iterator)local_30._M_current);
          iVar5 = piece_pos::priority(pvVar6,this);
          if ((this->m_dirty & 1U) == 0) {
            if ((priority == -1) && (-1 < iVar5)) {
              add(this,(piece_index_t)this_local._0_4_);
            }
            else if (-1 < priority) {
              update(this,priority,(prio_index_t)(pvVar6->index).m_val);
            }
          }
        }
        else {
          update_piece_state(this,(iterator)local_30._M_current);
        }
      }
    }
  }
  return;
}

Assistant:

void piece_picker::abort_download(piece_block const block, torrent_peer* peer)
	{
#ifdef TORRENT_EXPENSIVE_INVARIANT_CHECKS
		INVARIANT_CHECK;
#endif

#ifdef TORRENT_PICKER_LOG
		std::cerr << "[" << this << "] " << "abort_download( {" << block.piece_index << ", " << block.block_index << "} )" << std::endl;
#endif
		TORRENT_ASSERT(peer == nullptr || peer->in_use);

		TORRENT_ASSERT(block.block_index != piece_block::invalid.block_index);
		TORRENT_ASSERT(block.piece_index != piece_block::invalid.piece_index);

		auto const state = m_piece_map[block.piece_index].download_queue();
		if (state == piece_pos::piece_open) return;

		auto i = find_dl_piece(state, block.piece_index);
		TORRENT_ASSERT(i != m_downloads[state].end());

		auto const binfo = mutable_blocks_for_piece(*i);
		block_info& info = binfo[block.block_index];
		TORRENT_ASSERT(info.peer == nullptr || info.peer->in_use);
		TORRENT_ASSERT(info.piece_index == block.piece_index);

		TORRENT_ASSERT(info.state != block_info::state_none);

		if (info.state != block_info::state_requested) return;

		piece_pos const& p = m_piece_map[block.piece_index];
		int const prev_prio = p.priority(this);

#if TORRENT_USE_ASSERTS
		TORRENT_ASSERT(info.peers.count(peer));
		info.peers.erase(peer);
#endif
		TORRENT_ASSERT(info.num_peers > 0);
		if (info.num_peers > 0) --info.num_peers;
		if (info.peer == peer) info.peer = nullptr;
		TORRENT_ASSERT(info.peers.size() == info.num_peers);

		TORRENT_ASSERT(block.block_index < blocks_in_piece(block.piece_index));

		// if there are other peers, leave the block requested
		if (info.num_peers > 0) return;

		// clear the downloader of this block
		info.peer = nullptr;

		// clear this block as being downloaded
		info.state = block_info::state_none;
		TORRENT_ASSERT(i->requested > 0);
		--i->requested;

		// if there are no other blocks in this piece
		// that's being downloaded, remove it from the list
		if (i->requested + i->finished + i->writing == 0)
		{
			TORRENT_ASSERT(prev_prio < int(m_priority_boundaries.size())
				|| m_dirty);
			erase_download_piece(i);
			int const prio = p.priority(this);
			if (!m_dirty)
			{
				if (prev_prio == -1 && prio >= 0) add(block.piece_index);
				else if (prev_prio >= 0) update(prev_prio, p.index);
			}
			return;
		}

		i = update_piece_state(i);
	}